

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::refresh_torrent_status
          (session_impl *this,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *ret,
          status_flags_t flags)

{
  pointer ptVar1;
  pointer st;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  ptVar1 = (ret->
           super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (st = (ret->
            super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
            )._M_impl.super__Vector_impl_data._M_start; st != ptVar1; st = st + 1) {
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,st);
    if (local_38._M_ptr != (torrent *)0x0) {
      torrent::status(local_38._M_ptr,st,flags);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void session_impl::refresh_torrent_status(std::vector<torrent_status>* ret
		, status_flags_t const flags) const
	{
		for (auto& st : *ret)
		{
			auto t = st.handle.m_torrent.lock();
			if (!t) continue;
			t->status(&st, flags);
		}
	}